

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsapp.cc
# Opt level: O0

int __thiscall
FrobTadsApplication::fRunTads3
          (FrobTadsApplication *this,char *filename,int argc,char **argv,char *savedState,
          TadsNetConfig *netconfig)

{
  int iVar1;
  pointer pCVar2;
  char *in_RSI;
  long in_RDI;
  int vmRet;
  vm_run_image_params params;
  __single_object hostifc;
  CVmMainClientConsole clientifc;
  vm_run_image_params *in_stack_000002b0;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  CVmMainClientIfc *in_stack_ffffffffffffff18;
  CVmMainClientIfc local_38 [5];
  char *local_10;
  
  local_10 = in_RSI;
  CVmMainClientConsole::CVmMainClientConsole
            ((CVmMainClientConsole *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::make_unique<CVmHostIfcStdio,char_const(&)[1]>((char (*) [1])in_stack_ffffffffffffff18);
  pCVar2 = std::unique_ptr<CVmHostIfcStdio,_std::default_delete<CVmHostIfcStdio>_>::operator->
                     ((unique_ptr<CVmHostIfcStdio,_std::default_delete<CVmHostIfcStdio>_> *)0x219bd3
                     );
  (*(pCVar2->super_CVmHostIfcText).super_CVmHostIfc._vptr_CVmHostIfc[4])
            (pCVar2,(ulong)*(uint *)(in_RDI + 0x24),(ulong)*(uint *)(in_RDI + 0x28));
  pCVar2 = std::unique_ptr<CVmHostIfcStdio,_std::default_delete<CVmHostIfcStdio>_>::operator->
                     ((unique_ptr<CVmHostIfcStdio,_std::default_delete<CVmHostIfcStdio>_> *)0x219bf9
                     );
  (*(pCVar2->super_CVmHostIfcText).super_CVmHostIfc._vptr_CVmHostIfc[6])
            (pCVar2,(ulong)*(uint *)(in_RDI + 0x2c),(ulong)*(uint *)(in_RDI + 0x30));
  pCVar2 = std::unique_ptr<CVmHostIfcStdio,_std::default_delete<CVmHostIfcStdio>_>::get
                     ((unique_ptr<CVmHostIfcStdio,_std::default_delete<CVmHostIfcStdio>_> *)
                      CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  vm_run_image_params::vm_run_image_params
            ((vm_run_image_params *)&stack0xffffffffffffff18,local_38,(CVmHostIfc *)pCVar2,local_10)
  ;
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  iVar1 = vm_run_image(in_stack_000002b0);
  std::unique_ptr<CVmHostIfcStdio,_std::default_delete<CVmHostIfcStdio>_>::~unique_ptr
            ((unique_ptr<CVmHostIfcStdio,_std::default_delete<CVmHostIfcStdio>_> *)
             CONCAT44(iVar1,iVar1));
  CVmMainClientConsole::~CVmMainClientConsole((CVmMainClientConsole *)0x219ce0);
  return iVar1;
}

Assistant:

int
FrobTadsApplication::fRunTads3( char* filename, int argc, const char* const* argv,
                                const char *savedState, class TadsNetConfig* netconfig )
{
    // Create the Tads 3 host and client services interfaces.
    CVmMainClientConsole clientifc;
    const auto hostifc = std::make_unique<CVmHostIfcStdio>("");

    // Set the file I/O safety level.
    hostifc->set_io_safety(this->options.safetyLevelR, this->options.safetyLevelW);

    // Set the network safety level.
    hostifc->set_net_safety(this->options.netSafetyLevelC, this->options.netSafetyLevelS);

    // Set up the VM/program parameters.
    vm_run_image_params params(&clientifc, hostifc.get(), filename);
    params.prog_argv = argv;
    params.prog_argc = argc;
    params.script_file = this->options.replayFile.c_str();
    params.seed_rand = this->options.seedRand;
    params.saved_state = savedState;
    params.netconfig = netconfig;
    params.cmd_log_file = this->options.cmdLogFile.c_str();

    // Invoke the VM to run the program.
    int vmRet = vm_run_image(&params);

    // Return the result from the VM ivocation.
    return vmRet;
}